

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

uint8 * __thiscall
caffe::V0LayerParameter::InternalSerializeWithCachedSizesToArray
          (V0LayerParameter *this,bool deterministic,uint8 *target)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint32 uVar4;
  V0LayerParameter_PoolMethod value;
  uint uVar5;
  int32 iVar6;
  char *pcVar7;
  string *psVar8;
  BlobProto *value_00;
  uint8 *target_00;
  UnknownFieldSet *unknown_fields;
  float fVar9;
  uint local_68;
  uint n;
  uint i;
  uint32 cached_has_bits;
  uint8 *target_local;
  bool deterministic_local;
  V0LayerParameter *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  _i = target;
  if ((uVar1 & 1) != 0) {
    name_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    name_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.name");
    psVar8 = name_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(1,psVar8,target);
  }
  if ((uVar1 & 2) != 0) {
    type_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    type_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.type");
    psVar8 = type_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(2,psVar8,_i);
  }
  if ((uVar1 & 0x100) != 0) {
    uVar4 = num_output(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3,uVar4,_i);
  }
  if ((uVar1 & 0x800000) != 0) {
    bVar2 = biasterm(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(4,bVar2,_i);
  }
  if ((uVar1 & 0x20) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                   (5,this->weight_filler_,deterministic,_i);
  }
  if ((uVar1 & 0x40) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::FillerParameter>
                   (6,this->bias_filler_,deterministic,_i);
  }
  if ((uVar1 & 0x200) != 0) {
    uVar4 = pad(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7,uVar4,_i);
  }
  if ((uVar1 & 0x400) != 0) {
    uVar4 = kernelsize(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(8,uVar4,_i);
  }
  if ((uVar1 & 0x1000000) != 0) {
    uVar4 = group(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9,uVar4,_i);
  }
  if ((uVar1 & 0x2000000) != 0) {
    uVar4 = stride(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10,uVar4,_i);
  }
  if ((uVar1 & 0x800) != 0) {
    value = pool(this);
    _i = google::protobuf::internal::WireFormatLite::WriteEnumToArray(0xb,value,_i);
  }
  if ((uVar1 & 0x4000000) != 0) {
    fVar9 = dropout_ratio(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xc,fVar9,_i);
  }
  if ((uVar1 & 0x8000000) != 0) {
    uVar4 = local_size(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0xd,uVar4,_i);
  }
  if ((uVar1 & 0x10000000) != 0) {
    fVar9 = alpha(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xe,fVar9,_i);
  }
  if ((uVar1 & 0x20000000) != 0) {
    fVar9 = beta(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0xf,fVar9,_i);
  }
  if ((uVar1 & 4) != 0) {
    source_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    source_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.source");
    psVar8 = source_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x10,psVar8,_i);
  }
  if ((uVar1 & 0x40000000) != 0) {
    fVar9 = scale(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x11,fVar9,_i);
  }
  if ((uVar1 & 8) != 0) {
    meanfile_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    meanfile_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.meanfile");
    psVar8 = meanfile_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x12,psVar8,_i);
  }
  if ((uVar1 & 0x1000) != 0) {
    uVar4 = batchsize(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x13,uVar4,_i);
  }
  if ((uVar1 & 0x2000) != 0) {
    uVar4 = cropsize(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x14,uVar4,_i);
  }
  if ((uVar1 & 0x8000) != 0) {
    bVar2 = mirror(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x15,bVar2,_i);
  }
  if ((uVar1 & 0x80000000) != 0) {
    fVar9 = k(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x16,fVar9,_i);
  }
  local_68 = 0;
  uVar5 = blobs_size(this);
  for (; local_68 < uVar5; local_68 = local_68 + 1) {
    value_00 = blobs(this,local_68);
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::BlobProto>(0x32,value_00,deterministic,_i);
  }
  target_00 = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                        (0x33,&this->blobs_lr_,_i);
  _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray
                 (0x34,&this->weight_decay_,target_00);
  if ((uVar1 & 0x20000) != 0) {
    uVar4 = rand_skip(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x35,uVar4,_i);
  }
  uVar1 = (this->_has_bits_).has_bits_[1];
  if ((uVar1 & 1) != 0) {
    fVar9 = det_fg_threshold(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x36,fVar9,_i);
  }
  if ((uVar1 & 2) != 0) {
    fVar9 = det_bg_threshold(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x37,fVar9,_i);
  }
  if ((uVar1 & 4) != 0) {
    fVar9 = det_fg_fraction(this);
    _i = google::protobuf::internal::WireFormatLite::WriteFloatToArray(0x38,fVar9,_i);
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 0x40000) != 0) {
    uVar4 = det_context_pad(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x3a,uVar4,_i);
  }
  if ((uVar1 & 0x10) != 0) {
    det_crop_mode_abi_cxx11_(this);
    pcVar7 = (char *)std::__cxx11::string::data();
    det_crop_mode_abi_cxx11_(this);
    iVar3 = std::__cxx11::string::length();
    google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar7,iVar3,SERIALIZE,"caffe.V0LayerParameter.det_crop_mode");
    psVar8 = det_crop_mode_abi_cxx11_(this);
    _i = google::protobuf::internal::WireFormatLite::WriteStringToArray(0x3b,psVar8,_i);
  }
  if ((uVar1 & 0x80000) != 0) {
    iVar6 = new_num(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x3c,iVar6,_i);
  }
  if ((uVar1 & 0x100000) != 0) {
    iVar6 = new_channels(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x3d,iVar6,_i);
  }
  if ((uVar1 & 0x200000) != 0) {
    iVar6 = new_height(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x3e,iVar6,_i);
  }
  if ((uVar1 & 0x4000) != 0) {
    iVar6 = new_width(this);
    _i = google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x3f,iVar6,_i);
  }
  if ((uVar1 & 0x10000) != 0) {
    bVar2 = shuffle_images(this);
    _i = google::protobuf::internal::WireFormatLite::WriteBoolToArray(0x40,bVar2,_i);
  }
  if ((uVar1 & 0x400000) != 0) {
    uVar4 = concat_dim(this);
    _i = google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(0x41,uVar4,_i);
  }
  if ((uVar1 & 0x80) != 0) {
    _i = google::protobuf::internal::WireFormatLite::
         InternalWriteMessageNoVirtualToArray<caffe::HDF5OutputParameter>
                   (0x3e9,this->hdf5_output_param_,deterministic,_i);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = V0LayerParameter::unknown_fields(this);
    _i = google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(unknown_fields,_i);
  }
  return _i;
}

Assistant:

::google::protobuf::uint8* V0LayerParameter::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:caffe.V0LayerParameter)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional string type = 2;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->type().data(), this->type().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.type");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        2, this->type(), target);
  }

  // optional uint32 num_output = 3;
  if (cached_has_bits & 0x00000100u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(3, this->num_output(), target);
  }

  // optional bool biasterm = 4 [default = true];
  if (cached_has_bits & 0x00800000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(4, this->biasterm(), target);
  }

  // optional .caffe.FillerParameter weight_filler = 5;
  if (cached_has_bits & 0x00000020u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        5, *this->weight_filler_, deterministic, target);
  }

  // optional .caffe.FillerParameter bias_filler = 6;
  if (cached_has_bits & 0x00000040u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        6, *this->bias_filler_, deterministic, target);
  }

  // optional uint32 pad = 7 [default = 0];
  if (cached_has_bits & 0x00000200u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(7, this->pad(), target);
  }

  // optional uint32 kernelsize = 8;
  if (cached_has_bits & 0x00000400u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(8, this->kernelsize(), target);
  }

  // optional uint32 group = 9 [default = 1];
  if (cached_has_bits & 0x01000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(9, this->group(), target);
  }

  // optional uint32 stride = 10 [default = 1];
  if (cached_has_bits & 0x02000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(10, this->stride(), target);
  }

  // optional .caffe.V0LayerParameter.PoolMethod pool = 11 [default = MAX];
  if (cached_has_bits & 0x00000800u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteEnumToArray(
      11, this->pool(), target);
  }

  // optional float dropout_ratio = 12 [default = 0.5];
  if (cached_has_bits & 0x04000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(12, this->dropout_ratio(), target);
  }

  // optional uint32 local_size = 13 [default = 5];
  if (cached_has_bits & 0x08000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(13, this->local_size(), target);
  }

  // optional float alpha = 14 [default = 1];
  if (cached_has_bits & 0x10000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(14, this->alpha(), target);
  }

  // optional float beta = 15 [default = 0.75];
  if (cached_has_bits & 0x20000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(15, this->beta(), target);
  }

  // optional string source = 16;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->source().data(), this->source().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.source");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        16, this->source(), target);
  }

  // optional float scale = 17 [default = 1];
  if (cached_has_bits & 0x40000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(17, this->scale(), target);
  }

  // optional string meanfile = 18;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->meanfile().data(), this->meanfile().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.meanfile");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        18, this->meanfile(), target);
  }

  // optional uint32 batchsize = 19;
  if (cached_has_bits & 0x00001000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(19, this->batchsize(), target);
  }

  // optional uint32 cropsize = 20 [default = 0];
  if (cached_has_bits & 0x00002000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(20, this->cropsize(), target);
  }

  // optional bool mirror = 21 [default = false];
  if (cached_has_bits & 0x00008000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(21, this->mirror(), target);
  }

  // optional float k = 22 [default = 1];
  if (cached_has_bits & 0x80000000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(22, this->k(), target);
  }

  // repeated .caffe.BlobProto blobs = 50;
  for (unsigned int i = 0, n = this->blobs_size(); i < n; i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        50, this->blobs(i), deterministic, target);
  }

  // repeated float blobs_lr = 51;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(51, this->blobs_lr_, target);

  // repeated float weight_decay = 52;
  target = ::google::protobuf::internal::WireFormatLite::
    WriteFloatToArray(52, this->weight_decay_, target);

  // optional uint32 rand_skip = 53 [default = 0];
  if (cached_has_bits & 0x00020000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(53, this->rand_skip(), target);
  }

  cached_has_bits = _has_bits_[1];
  // optional float det_fg_threshold = 54 [default = 0.5];
  if (cached_has_bits & 0x00000001u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(54, this->det_fg_threshold(), target);
  }

  // optional float det_bg_threshold = 55 [default = 0.5];
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(55, this->det_bg_threshold(), target);
  }

  // optional float det_fg_fraction = 56 [default = 0.25];
  if (cached_has_bits & 0x00000004u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteFloatToArray(56, this->det_fg_fraction(), target);
  }

  cached_has_bits = _has_bits_[0];
  // optional uint32 det_context_pad = 58 [default = 0];
  if (cached_has_bits & 0x00040000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(58, this->det_context_pad(), target);
  }

  // optional string det_crop_mode = 59 [default = "warp"];
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->det_crop_mode().data(), this->det_crop_mode().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "caffe.V0LayerParameter.det_crop_mode");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        59, this->det_crop_mode(), target);
  }

  // optional int32 new_num = 60 [default = 0];
  if (cached_has_bits & 0x00080000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(60, this->new_num(), target);
  }

  // optional int32 new_channels = 61 [default = 0];
  if (cached_has_bits & 0x00100000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(61, this->new_channels(), target);
  }

  // optional int32 new_height = 62 [default = 0];
  if (cached_has_bits & 0x00200000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(62, this->new_height(), target);
  }

  // optional int32 new_width = 63 [default = 0];
  if (cached_has_bits & 0x00004000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteInt32ToArray(63, this->new_width(), target);
  }

  // optional bool shuffle_images = 64 [default = false];
  if (cached_has_bits & 0x00010000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteBoolToArray(64, this->shuffle_images(), target);
  }

  // optional uint32 concat_dim = 65 [default = 1];
  if (cached_has_bits & 0x00400000u) {
    target = ::google::protobuf::internal::WireFormatLite::WriteUInt32ToArray(65, this->concat_dim(), target);
  }

  // optional .caffe.HDF5OutputParameter hdf5_output_param = 1001;
  if (cached_has_bits & 0x00000080u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        1001, *this->hdf5_output_param_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:caffe.V0LayerParameter)
  return target;
}